

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strencodings.h
# Opt level: O0

optional<unsigned_int> ToIntegral<unsigned_int>(string_view str)

{
  optional<unsigned_int> *this;
  uint *__t;
  const_pointer pvVar1;
  const_pointer pvVar2;
  size_type sVar3;
  char *in_RSI;
  long in_FS_OFFSET;
  __integer_from_chars_result_type<unsigned_int> _Var4;
  char *first_nonmatching;
  uint result;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff98;
  undefined8 in_stack_ffffffffffffffb8;
  int __base;
  uint *in_stack_ffffffffffffffc0;
  char *in_stack_ffffffffffffffc8;
  _Optional_payload_base<unsigned_int> local_10;
  long local_8;
  
  __base = (int)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this = (optional<unsigned_int> *)
         std::basic_string_view<char,_std::char_traits<char>_>::data(in_stack_ffffffffffffff98);
  __t = (uint *)std::basic_string_view<char,_std::char_traits<char>_>::data
                          (in_stack_ffffffffffffff98);
  std::basic_string_view<char,_std::char_traits<char>_>::size(in_stack_ffffffffffffff98);
  _Var4 = std::from_chars<unsigned_int>
                    (in_RSI,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,__base);
  pvVar1 = _Var4.ptr;
  pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::data(in_stack_ffffffffffffff98);
  sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::size(in_stack_ffffffffffffff98);
  if ((pvVar1 == pvVar2 + sVar3) && (_Var4.ec == 0)) {
    std::optional<unsigned_int>::optional<unsigned_int,_true>(this,__t);
  }
  else {
    std::optional<unsigned_int>::optional((optional<unsigned_int> *)&local_10);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (optional<unsigned_int>)local_10;
  }
  __stack_chk_fail();
}

Assistant:

std::optional<T> ToIntegral(std::string_view str)
{
    static_assert(std::is_integral<T>::value);
    T result;
    const auto [first_nonmatching, error_condition] = std::from_chars(str.data(), str.data() + str.size(), result);
    if (first_nonmatching != str.data() + str.size() || error_condition != std::errc{}) {
        return std::nullopt;
    }
    return result;
}